

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandLines
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  reference cmd_00;
  string *cmd;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  uint local_254;
  undefined1 local_250 [4];
  uint i;
  string launcher;
  string local_210;
  allocator local_1e9;
  string local_1e8 [8];
  string cdStr;
  ostringstream cdCmd;
  undefined1 local_40 [8];
  string wd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLines_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalNinjaGenerator *this_local;
  
  wd.field_2._8_8_ = cmdLines;
  uVar2 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
  if (uVar2 != 0) {
    cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_((string *)local_40,ccg);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::__cxx11::string::operator=((string *)local_40,pcVar5);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(cdStr.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"cd ",&local_1e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    poVar6 = std::operator<<((ostream *)((long)&cdStr.field_2 + 8),local_1e8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_210,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)local_40,SHELL);
    std::operator<<(poVar6,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    uVar1 = wd.field_2._8_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)uVar1,(value_type *)((long)&launcher.field_2 + 8));
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(cdStr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_40);
  }
  MakeCustomLauncher_abi_cxx11_((string *)local_250,this,ccg);
  for (local_254 = 0; uVar2 = local_254, uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg),
      uVar1 = wd.field_2._8_8_, uVar2 != uVar3; local_254 = local_254 + 1) {
    cmCustomCommandGenerator::GetCommand_abi_cxx11_((string *)&cmd,ccg,local_254);
    cmOutputConverter::ConvertToOutputFormat
              (&local_298,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)&cmd,SHELL);
    std::operator+(&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   &local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)uVar1,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&cmd);
    cmd_00 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)wd.field_2._8_8_);
    cmCustomCommandGenerator::AppendArguments(ccg,local_254,cmd_00);
  }
  std::__cxx11::string::~string((string *)local_250);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandLines(
  cmCustomCommandGenerator const& ccg,
  std::vector<std::string> &cmdLines)
{
  if (ccg.GetNumberOfCommands() > 0) {
    std::string wd = ccg.GetWorkingDirectory();
    if (wd.empty())
      wd = this->GetCurrentBinaryDirectory();

    std::ostringstream cdCmd;
#ifdef _WIN32
        std::string cdStr = "cd /D ";
#else
        std::string cdStr = "cd ";
#endif
    cdCmd << cdStr << this->ConvertToOutputFormat(wd, SHELL);
    cmdLines.push_back(cdCmd.str());
  }

  std::string launcher = this->MakeCustomLauncher(ccg);

  for (unsigned i = 0; i != ccg.GetNumberOfCommands(); ++i) {
    cmdLines.push_back(launcher +
      this->ConvertToOutputFormat(ccg.GetCommand(i), SHELL));

    std::string& cmd = cmdLines.back();
    ccg.AppendArguments(i, cmd);
  }
}